

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

Node * __thiscall
TMap<FPortalID,_TArray<FPortalSector,_FPortalSector>,_THashTraits<FPortalID>,_TValueTraits<TArray<FPortalSector,_FPortalSector>_>_>
::NewKey(TMap<FPortalID,_TArray<FPortalSector,_FPortalSector>,_THashTraits<FPortalID>,_TValueTraits<TArray<FPortalSector,_FPortalSector>_>_>
         *this,FPortalID *key)

{
  DVector2 DVar1;
  double dVar2;
  FPortalSector *pFVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node *pNVar8;
  uint uVar9;
  uint uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  FPortalID local_28;
  
  DVar1 = key->mDisplacement;
  uVar11 = DVar1.X._0_4_;
  uVar12 = DVar1.X._4_4_;
  uVar13 = DVar1.Y._0_4_;
  uVar14 = DVar1.Y._4_4_;
  pNVar6 = this->Nodes;
  uVar9 = this->Size - 1;
  uVar10 = SUB84(DVar1.Y + 103079215104.0,0) * 0x100 + (SUB84(DVar1.X + 103079215104.0,0) >> 8) &
           uVar9;
  pNVar4 = pNVar6 + uVar10;
  pNVar5 = pNVar4->Next;
  if (pNVar5 != (Node *)0x1) {
    pNVar8 = this->LastFree;
    do {
      pNVar7 = pNVar8;
      pNVar8 = pNVar7 + -1;
      if (pNVar7 <= pNVar6) {
        this->LastFree = pNVar8;
        Resize(this,this->Size * 2);
        local_28.mDisplacement.X = (key->mDisplacement).X;
        local_28.mDisplacement.Y = (key->mDisplacement).Y;
        pNVar4 = NewKey(this,&local_28);
        return pNVar4;
      }
    } while (pNVar8->Next != (Node *)0x1);
    this->LastFree = pNVar8;
    uVar9 = SUB84((pNVar4->Pair).Key.mDisplacement.Y + 103079215104.0,0) * 0x100 +
            (SUB84((pNVar4->Pair).Key.mDisplacement.X + 103079215104.0,0) >> 8) & uVar9;
    if (uVar9 == uVar10) {
      pNVar8->Next = pNVar5;
      pNVar6 = pNVar8;
      goto LAB_00373182;
    }
    pNVar6 = pNVar6 + uVar9;
    do {
      pNVar5 = pNVar6;
      pNVar6 = pNVar5->Next;
    } while (pNVar6 != pNVar4);
    pNVar5->Next = pNVar8;
    uVar9 = (pNVar4->Pair).Value.Count;
    pNVar7[-1].Pair.Value.Most = (pNVar4->Pair).Value.Most;
    pNVar7[-1].Pair.Value.Count = uVar9;
    pNVar6 = pNVar4->Next;
    dVar2 = (pNVar4->Pair).Key.mDisplacement.X;
    pFVar3 = (pNVar4->Pair).Value.Array;
    pNVar7[-1].Pair.Key.mDisplacement.Y = (pNVar4->Pair).Key.mDisplacement.Y;
    pNVar7[-1].Pair.Value.Array = pFVar3;
    pNVar8->Next = pNVar6;
    pNVar7[-1].Pair.Key.mDisplacement.X = dVar2;
    uVar11 = *(undefined4 *)&(key->mDisplacement).X;
    uVar12 = *(undefined4 *)((long)&(key->mDisplacement).X + 4);
    uVar13 = *(undefined4 *)&(key->mDisplacement).Y;
    uVar14 = *(undefined4 *)((long)&(key->mDisplacement).Y + 4);
  }
  pNVar8 = (Node *)0x0;
  pNVar6 = pNVar4;
LAB_00373182:
  pNVar4->Next = pNVar8;
  this->NumUsed = this->NumUsed + 1;
  *(undefined4 *)&(pNVar6->Pair).Key.mDisplacement.X = uVar11;
  *(undefined4 *)((long)&(pNVar6->Pair).Key.mDisplacement.X + 4) = uVar12;
  *(undefined4 *)&(pNVar6->Pair).Key.mDisplacement.Y = uVar13;
  *(undefined4 *)((long)&(pNVar6->Pair).Key.mDisplacement.Y + 4) = uVar14;
  return pNVar6;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}